

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

void tinyexr::SetErrorMessage(string *msg,char **err)

{
  char *pcVar1;
  
  if (err != (char **)0x0) {
    pcVar1 = strdup((msg->_M_dataplus)._M_p);
    *err = pcVar1;
  }
  return;
}

Assistant:

static void SetErrorMessage(const std::string &msg, const char **err) {
  if (err) {
#ifdef _WIN32
    (*err) = _strdup(msg.c_str());
#else
    (*err) = strdup(msg.c_str());
#endif
  }
}